

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmrig.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  Id id;
  int iVar1;
  Process process;
  App app;
  Process PStack_58;
  App local_30;
  
  xmrig::Process::Process(&PStack_58,argc,argv);
  id = xmrig::Entry::get(&PStack_58);
  if (id == Default) {
    xmrig::App::App(&local_30,&PStack_58);
    iVar1 = xmrig::App::exec(&local_30);
    xmrig::App::~App(&local_30);
  }
  else {
    iVar1 = xmrig::Entry::exec(&PStack_58,id);
  }
  std::vector<xmrig::String,_std::allocator<xmrig::String>_>::~vector(&PStack_58.m_arguments.m_data)
  ;
  return iVar1;
}

Assistant:

int main(int argc, char **argv) {
    using namespace xmrig;

    Process process(argc, argv);
    const Entry::Id entry = Entry::get(process);
    if (entry) {
        return Entry::exec(process, entry);
    }

    App app(&process);

    return app.exec();
}